

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1ResizeHash(PCache1 *p)

{
  long lVar1;
  void *pvVar2;
  uint uVar3;
  long in_RDI;
  uint h;
  PgHdr1 *pNext;
  PgHdr1 *pPage;
  uint i;
  uint nNew;
  PgHdr1 **apNew;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = *(int *)(in_RDI + 0x3c) << 1;
  if (local_14 < 0x100) {
    local_14 = 0x100;
  }
  if (*(int *)(in_RDI + 0x3c) != 0) {
    sqlite3BeginBenignMalloc();
  }
  pvVar2 = sqlite3MallocZero(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (*(int *)(in_RDI + 0x3c) != 0) {
    sqlite3EndBenignMalloc();
  }
  if (pvVar2 != (void *)0x0) {
    for (local_18 = 0; local_18 < *(uint *)(in_RDI + 0x3c); local_18 = local_18 + 1) {
      local_28 = *(long *)(*(long *)(in_RDI + 0x40) + (ulong)local_18 * 8);
      while (local_28 != 0) {
        uVar3 = *(uint *)(local_28 + 0x10) % local_14;
        lVar1 = *(long *)(local_28 + 0x18);
        *(undefined8 *)(local_28 + 0x18) = *(undefined8 *)((long)pvVar2 + (ulong)uVar3 * 8);
        *(long *)((long)pvVar2 + (ulong)uVar3 * 8) = local_28;
        local_28 = lVar1;
      }
    }
    sqlite3_free((void *)0x23b3c1);
    *(void **)(in_RDI + 0x40) = pvVar2;
    *(uint *)(in_RDI + 0x3c) = local_14;
  }
  return;
}

Assistant:

static void pcache1ResizeHash(PCache1 *p){
  PgHdr1 **apNew;
  unsigned int nNew;
  unsigned int i;

  assert( sqlite3_mutex_held(p->pGroup->mutex) );

  nNew = p->nHash*2;
  if( nNew<256 ){
    nNew = 256;
  }

  pcache1LeaveMutex(p->pGroup);
  if( p->nHash ){ sqlite3BeginBenignMalloc(); }
  apNew = (PgHdr1 **)sqlite3MallocZero(sizeof(PgHdr1 *)*nNew);
  if( p->nHash ){ sqlite3EndBenignMalloc(); }
  pcache1EnterMutex(p->pGroup);
  if( apNew ){
    for(i=0; i<p->nHash; i++){
      PgHdr1 *pPage;
      PgHdr1 *pNext = p->apHash[i];
      while( (pPage = pNext)!=0 ){
        unsigned int h = pPage->iKey % nNew;
        pNext = pPage->pNext;
        pPage->pNext = apNew[h];
        apNew[h] = pPage;
      }
    }
    sqlite3_free(p->apHash);
    p->apHash = apNew;
    p->nHash = nNew;
  }
}